

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::detail::MultipartFormDataParser::parse
          (MultipartFormDataParser *this,char *buf,size_t n,ContentReceiver *content_callback,
          MultipartContentHeader *header_callback)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  const_reference pvVar5;
  char *pcVar6;
  unsigned_long __args_1;
  ulong uVar7;
  ulong uVar8;
  string *psVar9;
  long lVar10;
  undefined1 local_1f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pattern_3;
  size_type pos_3;
  undefined1 local_1b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pattern_2;
  size_t pos_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pattern_1;
  string_type local_148;
  undefined1 local_128 [8];
  smatch m;
  string local_e8;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  long local_a0;
  size_type pos_1;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pattern;
  MultipartContentHeader *header_callback_local;
  ContentReceiver *content_callback_local;
  size_t n_local;
  char *buf_local;
  MultipartFormDataParser *this_local;
  
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::re_content_disposition_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::re_content_disposition_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::re_content_disposition_abi_cxx11_,
               "^Content-Disposition:\\s*form-data;\\s*name=\"(.*?)\"(?:;\\s*filename=\"(.*?)\")?\\s*$"
               ,1);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::re_content_disposition_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::re_content_disposition_abi_cxx11_);
  }
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::dash__abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::dash__abi_cxx11_), iVar4 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::dash__abi_cxx11_,"--",(allocator<char> *)(pattern.field_2._M_local_buf + 0xb));
    std::allocator<char>::~allocator((allocator<char> *)(pattern.field_2._M_local_buf + 0xb));
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::dash__abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::dash__abi_cxx11_);
  }
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::crlf__abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::crlf__abi_cxx11_), iVar4 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::crlf__abi_cxx11_,"\r\n",(allocator<char> *)(pattern.field_2._M_local_buf + 10));
    std::allocator<char>::~allocator((allocator<char> *)(pattern.field_2._M_local_buf + 10));
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::crlf__abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::crlf__abi_cxx11_);
  }
  std::__cxx11::string::append((char *)&this->buf_,(ulong)buf);
  do {
    bVar2 = std::__cxx11::string::empty();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      this_local._7_1_ = 1;
      goto LAB_00148f8e;
    }
    switch(this->state_) {
    case 0:
      std::operator+(&local_88,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::dash__abi_cxx11_,&this->boundary_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     &local_88,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::crlf__abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_88);
      uVar7 = std::__cxx11::string::size();
      uVar8 = std::__cxx11::string::size();
      if (uVar8 < uVar7) {
        this_local._7_1_ = 1;
        pos._4_4_ = 1;
      }
      else {
        lVar10 = std::__cxx11::string::find((string *)&this->buf_,(ulong)local_68);
        if (lVar10 == 0) {
          std::__cxx11::string::size();
          std::__cxx11::string::erase((ulong)&this->buf_,0);
          lVar10 = std::__cxx11::string::size();
          this->off_ = lVar10 + this->off_;
          this->state_ = 1;
          pos._4_4_ = 4;
        }
        else {
          this_local._7_1_ = 0;
          pos._4_4_ = 1;
        }
      }
      std::__cxx11::string::~string((string *)local_68);
      if (pos._4_4_ == 1) goto LAB_00148f8e;
      break;
    case 1:
      clear_file_info(this);
      this->state_ = 2;
      break;
    case 2:
      local_a0 = std::__cxx11::string::find((string *)&this->buf_,0x1cccd0);
      while (local_a0 != -1) {
        if (local_a0 == 0) {
          bVar3 = std::function<bool_(const_httplib::MultipartFormData_&)>::operator()
                            (header_callback,&this->file_);
          if (!bVar3) {
            this->is_valid_ = false;
            this_local._7_1_ = 0;
            goto LAB_00148f8e;
          }
          std::__cxx11::string::size();
          std::__cxx11::string::erase((ulong)&this->buf_,0);
          lVar10 = std::__cxx11::string::size();
          this->off_ = lVar10 + this->off_;
          this->state_ = 3;
          break;
        }
        if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
             ::header_name_abi_cxx11_ == '\0') &&
           (iVar4 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                         ::header_name_abi_cxx11_), iVar4 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::header_name_abi_cxx11_,"content-type:",
                     (allocator<char> *)(header.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(header.field_2._M_local_buf + 0xf));
          __cxa_atexit(std::__cxx11::string::~string,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::header_name_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                               ::header_name_abi_cxx11_);
        }
        std::__cxx11::string::substr((ulong)local_c8,(ulong)&this->buf_);
        bVar3 = start_with_case_ignore
                          (this,(string *)local_c8,
                           &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                            ::header_name_abi_cxx11_);
        if (bVar3) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)&m._M_begin,(ulong)local_c8);
          trim_copy(&local_e8,(string *)&m._M_begin);
          std::__cxx11::string::operator=((string *)&(this->file_).content_type,(string *)&local_e8)
          ;
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&m._M_begin);
        }
        else {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_128);
          bVar3 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_c8,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)local_128,
                             &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                              ::re_content_disposition_abi_cxx11_,0);
          if (bVar3) {
            pvVar5 = std::__cxx11::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_128,1);
            std::__cxx11::sub_match::operator_cast_to_string(&local_148,(sub_match *)pvVar5);
            std::__cxx11::string::operator=((string *)&this->file_,(string *)&local_148);
            std::__cxx11::string::~string((string *)&local_148);
            pvVar5 = std::__cxx11::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_128,2);
            std::__cxx11::sub_match::operator_cast_to_string
                      ((string_type *)((long)&pattern_1.field_2 + 8),(sub_match *)pvVar5);
            std::__cxx11::string::operator=
                      ((string *)&(this->file_).filename,
                       (string *)(pattern_1.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(pattern_1.field_2._M_local_buf + 8));
          }
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_128);
        }
        std::__cxx11::string::size();
        std::__cxx11::string::erase((ulong)&this->buf_,0);
        lVar10 = std::__cxx11::string::size();
        this->off_ = local_a0 + lVar10 + this->off_;
        local_a0 = std::__cxx11::string::find((string *)&this->buf_,0x1cccd0);
        std::__cxx11::string::~string((string *)local_c8);
      }
      if (this->state_ != 3) {
        this_local._7_1_ = 1;
        goto LAB_00148f8e;
      }
      break;
    case 3:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos_2,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::crlf__abi_cxx11_,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::dash__abi_cxx11_);
      uVar7 = std::__cxx11::string::size();
      uVar8 = std::__cxx11::string::size();
      if (uVar8 < uVar7) {
        this_local._7_1_ = 1;
        bVar3 = true;
      }
      else {
        pattern_2.field_2._8_8_ = find_string(this,&this->buf_,(string *)&pos_2);
        pcVar6 = (char *)std::__cxx11::string::data();
        bVar3 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                          (content_callback,pcVar6,pattern_2.field_2._8_8_);
        if (bVar3) {
          this->off_ = this->off_ + pattern_2.field_2._8_8_;
          std::__cxx11::string::erase((ulong)&this->buf_,0);
          bVar3 = false;
        }
        else {
          this->is_valid_ = false;
          this_local._7_1_ = 0;
          bVar3 = true;
        }
      }
      std::__cxx11::string::~string((string *)&pos_2);
      if (bVar3) goto LAB_00148f8e;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos_3,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::crlf__abi_cxx11_,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::dash__abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos_3,
                     &this->boundary_);
      std::__cxx11::string::~string((string *)&pos_3);
      uVar7 = std::__cxx11::string::size();
      uVar8 = std::__cxx11::string::size();
      if (uVar8 < uVar7) {
        this_local._7_1_ = 1;
        bVar3 = true;
      }
      else {
        pattern_3.field_2._8_8_ = std::__cxx11::string::find((string *)&this->buf_,(ulong)local_1b0)
        ;
        if (pattern_3.field_2._8_8_ == -1) {
          pcVar6 = (char *)std::__cxx11::string::data();
          __args_1 = std::__cxx11::string::size();
          bVar3 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                            (content_callback,pcVar6,__args_1);
          if (bVar3) {
            lVar10 = std::__cxx11::string::size();
            this->off_ = this->off_ + lVar10;
            std::__cxx11::string::size();
            std::__cxx11::string::erase((ulong)&this->buf_,0);
            goto LAB_00148d12;
          }
          this->is_valid_ = false;
          this_local._7_1_ = 0;
          bVar3 = true;
        }
        else {
          pcVar6 = (char *)std::__cxx11::string::data();
          bVar3 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                            (content_callback,pcVar6,pattern_3.field_2._8_8_);
          uVar1 = pattern_3.field_2._8_8_;
          if (bVar3) {
            lVar10 = std::__cxx11::string::size();
            this->off_ = this->off_ + uVar1 + lVar10;
            std::__cxx11::string::size();
            std::__cxx11::string::erase((ulong)&this->buf_,0);
            this->state_ = 4;
LAB_00148d12:
            bVar3 = false;
          }
          else {
            this->is_valid_ = false;
            this_local._7_1_ = 0;
            bVar3 = true;
          }
        }
      }
      std::__cxx11::string::~string((string *)local_1b0);
      if (bVar3) goto LAB_00148f8e;
      break;
    case 4:
      uVar7 = std::__cxx11::string::size();
      uVar8 = std::__cxx11::string::size();
      if (uVar8 < uVar7) {
        this_local._7_1_ = 1;
        goto LAB_00148f8e;
      }
      psVar9 = (string *)std::__cxx11::string::size();
      iVar4 = std::__cxx11::string::compare((ulong)&this->buf_,0,psVar9);
      if (iVar4 == 0) {
        std::__cxx11::string::size();
        std::__cxx11::string::erase((ulong)&this->buf_,0);
        lVar10 = std::__cxx11::string::size();
        this->off_ = lVar10 + this->off_;
        this->state_ = 1;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::dash__abi_cxx11_,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::crlf__abi_cxx11_);
        uVar7 = std::__cxx11::string::size();
        uVar8 = std::__cxx11::string::size();
        if (uVar8 < uVar7) {
          this_local._7_1_ = 1;
          bVar3 = true;
        }
        else {
          psVar9 = (string *)std::__cxx11::string::size();
          iVar4 = std::__cxx11::string::compare((ulong)&this->buf_,0,psVar9);
          if (iVar4 == 0) {
            std::__cxx11::string::size();
            std::__cxx11::string::erase((ulong)&this->buf_,0);
            lVar10 = std::__cxx11::string::size();
            this->off_ = lVar10 + this->off_;
            this->is_valid_ = true;
            this->state_ = 5;
            bVar3 = false;
          }
          else {
            this_local._7_1_ = 1;
            bVar3 = true;
          }
        }
        std::__cxx11::string::~string((string *)local_1f8);
        if (bVar3) goto LAB_00148f8e;
      }
      break;
    case 5:
      this->is_valid_ = false;
      this_local._7_1_ = 0;
LAB_00148f8e:
      return (bool)(this_local._7_1_ & 1);
    }
  } while( true );
}

Assistant:

bool parse(const char *buf, size_t n, const ContentReceiver &content_callback,
					   const MultipartContentHeader &header_callback) {

				static const std::regex re_content_disposition(
						"^Content-Disposition:\\s*form-data;\\s*name=\"(.*?)\"(?:;\\s*filename="
						"\"(.*?)\")?\\s*$",
						std::regex_constants::icase);
				static const std::string dash_ = "--";
				static const std::string crlf_ = "\r\n";

				buf_.append(buf, n); // TODO: performance improvement

				while (!buf_.empty()) {
					switch (state_) {
						case 0: { // Initial boundary
							auto pattern = dash_ + boundary_ + crlf_;
							if (pattern.size() > buf_.size()) { return true; }
							auto pos = buf_.find(pattern);
							if (pos != 0) { return false; }
							buf_.erase(0, pattern.size());
							off_ += pattern.size();
							state_ = 1;
							break;
						}
						case 1: { // New entry
							clear_file_info();
							state_ = 2;
							break;
						}
						case 2: { // Headers
							auto pos = buf_.find(crlf_);
							while (pos != std::string::npos) {
								// Empty line
								if (pos == 0) {
									if (!header_callback(file_)) {
										is_valid_ = false;
										return false;
									}
									buf_.erase(0, crlf_.size());
									off_ += crlf_.size();
									state_ = 3;
									break;
								}

								static const std::string header_name = "content-type:";
								const auto header = buf_.substr(0, pos);
								if (start_with_case_ignore(header, header_name)) {
									file_.content_type = trim_copy(header.substr(header_name.size()));
								} else {
									std::smatch m;
									if (std::regex_match(header, m, re_content_disposition)) {
										file_.name = m[1];
										file_.filename = m[2];
									}
								}

								buf_.erase(0, pos + crlf_.size());
								off_ += pos + crlf_.size();
								pos = buf_.find(crlf_);
							}
							if (state_ != 3) { return true; }
							break;
						}
						case 3: { // Body
							{
								auto pattern = crlf_ + dash_;
								if (pattern.size() > buf_.size()) { return true; }

								auto pos = find_string(buf_, pattern);

								if (!content_callback(buf_.data(), pos)) {
									is_valid_ = false;
									return false;
								}

								off_ += pos;
								buf_.erase(0, pos);
							}
							{
								auto pattern = crlf_ + dash_ + boundary_;
								if (pattern.size() > buf_.size()) { return true; }

								auto pos = buf_.find(pattern);
								if (pos != std::string::npos) {
									if (!content_callback(buf_.data(), pos)) {
										is_valid_ = false;
										return false;
									}

									off_ += pos + pattern.size();
									buf_.erase(0, pos + pattern.size());
									state_ = 4;
								} else {
									if (!content_callback(buf_.data(), pattern.size())) {
										is_valid_ = false;
										return false;
									}

									off_ += pattern.size();
									buf_.erase(0, pattern.size());
								}
							}
							break;
						}
						case 4: { // Boundary
							if (crlf_.size() > buf_.size()) { return true; }
							if (buf_.compare(0, crlf_.size(), crlf_) == 0) {
								buf_.erase(0, crlf_.size());
								off_ += crlf_.size();
								state_ = 1;
							} else {
								auto pattern = dash_ + crlf_;
								if (pattern.size() > buf_.size()) { return true; }
								if (buf_.compare(0, pattern.size(), pattern) == 0) {
									buf_.erase(0, pattern.size());
									off_ += pattern.size();
									is_valid_ = true;
									state_ = 5;
								} else {
									return true;
								}
							}
							break;
						}
						case 5: { // Done
							is_valid_ = false;
							return false;
						}
					}
				}

				return true;
			}